

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ListColumnCheckpointState::GetStatistics(ListColumnCheckpointState *this)

{
  pointer this_00;
  pointer pCVar1;
  long in_RSI;
  BaseStatistics stats;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_70;
  BaseStatistics local_68;
  
  this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
            operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                        *)(in_RSI + 0x80));
  BaseStatistics::Copy(&local_68,this_00);
  pCVar1 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                         *)(in_RSI + 0x98));
  (*pCVar1->_vptr_ColumnCheckpointState[2])(&local_70,pCVar1);
  ListStats::SetChildStats
            (&local_68,
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)&local_70);
  if (local_70._M_head_impl != (BaseStatistics *)0x0) {
    BaseStatistics::~BaseStatistics(local_70._M_head_impl);
    operator_delete(local_70._M_head_impl);
  }
  local_70._M_head_impl = (BaseStatistics *)0x0;
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&local_68);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> GetStatistics() override {
		auto stats = global_stats->Copy();
		ListStats::SetChildStats(stats, child_state->GetStatistics());
		return stats.ToUnique();
	}